

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O1

void __thiscall
singleParticleSpectra::calculate_four_particle_correlation_Cn4
          (singleParticleSpectra *this,vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<double,_std::allocator<double>_> *corr,
          vector<double,_std::allocator<double>_> *corr_err)

{
  pretty_ostream *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  string local_38;
  
  iVar5 = this->num_Cn4;
  if (0 < (long)iVar5) {
    pdVar7 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = *pdVar7;
    iVar6 = this->order_max;
    pdVar8 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (corr->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (corr_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      if (iVar6 < lVar11) {
        this_00 = &this->messager;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Error: the vn needed for C_n{4} is not ",0x27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"computed, order_max = ",0x16);
        std::ostream::operator<<(this_00,this->order_max);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"2n = ",5);
        std::ostream::operator<<(this_00,(int)lVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,". Make sure order_max > 2n!",0x1b);
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"error","");
        pretty_ostream::flush(this_00,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        exit(1);
      }
      dVar12 = *(double *)((long)pdVar7 + lVar11 * 4);
      dVar2 = *(double *)((long)pdVar8 + lVar11 * 4);
      dVar3 = pdVar7[lVar11];
      dVar4 = pdVar8[lVar11];
      dVar13 = dVar12 * dVar12 + dVar2 * dVar2;
      dVar12 = (dVar3 * dVar12 + dVar2 * dVar4) * dVar12 + (dVar4 * dVar12 - dVar2 * dVar3) * dVar2;
      dVar12 = (dVar13 * dVar13 - (dVar12 + dVar12)) + (dVar1 + -2.0) * -4.0 * dVar13 +
               dVar3 * dVar3 + dVar4 * dVar4 + (dVar1 + -3.0) * (dVar1 + dVar1);
      *(double *)((long)pdVar9 + lVar11 * 4) = *(double *)((long)pdVar9 + lVar11 * 4) + dVar12;
      *(double *)((long)pdVar10 + lVar11 * 4) =
           dVar12 * dVar12 + *(double *)((long)pdVar10 + lVar11 * 4);
      lVar11 = lVar11 + 2;
    } while ((long)iVar5 * 2 != lVar11);
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_four_particle_correlation_Cn4(
    vector<double> &event_Qn_real, vector<double> &event_Qn_imag,
    vector<double> &corr, vector<double> &corr_err) {
    // C_n[0] = N(N-1)(N-2)(N-3) is the number of pairs
    double dN = event_Qn_real[0];
    for (int i = 0; i < num_Cn4; i++) {
        int ii = 2 * i;
        if (ii > order_max) {
            messager << "Error: the vn needed for C_n{4} is not "
                     << "computed, order_max = " << order_max << "2n = " << ii
                     << ". Make sure order_max > 2n!";
            messager.flush("error");
            exit(1);
        }
        double abs_Qn_2 =
            (event_Qn_real[i] * event_Qn_real[i]
             + event_Qn_imag[i] * event_Qn_imag[i]);
        double abs_Q2n_2 =
            (event_Qn_real[ii] * event_Qn_real[ii]
             + event_Qn_imag[ii] * event_Qn_imag[ii]);

        double Re_Q2n_QnQn =
            (event_Qn_real[i]
                 * (event_Qn_real[ii] * event_Qn_real[i]
                    + event_Qn_imag[ii] * event_Qn_imag[i])
             + event_Qn_imag[i]
                   * (event_Qn_real[i] * event_Qn_imag[ii]
                      - event_Qn_real[ii] * event_Qn_imag[i]));

        double corr_local =
            (abs_Qn_2 * abs_Qn_2 - 2. * Re_Q2n_QnQn - 4. * (dN - 2.) * abs_Qn_2
             + abs_Q2n_2 + 2. * dN * (dN - 3.));
        corr[i] += corr_local;
        corr_err[i] += corr_local * corr_local;
    }
}